

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O0

string * __thiscall
lest::
to_string<nonstd::sv_lite::basic_string_view<char,std::char_traits<char>>,nonstd::sv_lite::basic_string_view<char,std::char_traits<char>>>
          (string *__return_storage_ptr__,lest *this,
          basic_string_view<char,_std::char_traits<char>_> *lhs,string *op,
          basic_string_view<char,_std::char_traits<char>_> *rhs)

{
  ostream *poVar1;
  basic_string_view<char,_std::char_traits<char>_> v;
  basic_string_view<char,_std::char_traits<char>_> v_00;
  string local_250 [39];
  allocator<char> local_229;
  sv_lite *local_228;
  const_pointer pcStack_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  allocator<char> local_1d9;
  sv_lite *local_1d8;
  const_pointer pcStack_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  ostringstream local_1a0 [8];
  ostringstream os;
  basic_string_view<char,_std::char_traits<char>_> *rhs_local;
  string *op_local;
  basic_string_view<char,_std::char_traits<char>_> *lhs_local;
  
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  local_1d8 = *(sv_lite **)this;
  pcStack_1d0 = *(const_pointer *)(this + 8);
  std::allocator<char>::allocator();
  v.size_ = (size_type)&local_1d9;
  v.data_ = pcStack_1d0;
  nonstd::sv_lite::to_string<char,std::char_traits<char>,std::allocator<char>>
            (&local_1c0,local_1d8,v,(allocator<char> *)rhs);
  poVar1 = std::operator<<((ostream *)local_1a0,(string *)&local_1c0);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = std::operator<<(poVar1,(string *)lhs);
  poVar1 = std::operator<<(poVar1," ");
  local_228 = *(sv_lite **)op;
  pcStack_220 = (const_pointer)op->_M_string_length;
  std::allocator<char>::allocator();
  v_00.size_ = (size_type)&local_229;
  v_00.data_ = pcStack_220;
  nonstd::sv_lite::to_string<char,std::char_traits<char>,std::allocator<char>>
            (&local_210,local_228,v_00,(allocator<char> *)rhs);
  std::operator<<(poVar1,(string *)&local_210);
  std::__cxx11::string::~string((string *)&local_210);
  std::allocator<char>::~allocator(&local_229);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::allocator<char>::~allocator(&local_1d9);
  std::__cxx11::ostringstream::str();
  std::__cxx11::string::string((string *)__return_storage_ptr__,local_250);
  std::__cxx11::string::~string(local_250);
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string( L const & lhs, std::string op, R const & rhs )
{
    std::ostringstream os; os << to_string( lhs ) << " " << op << " " << to_string( rhs ); return os.str();
}